

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O0

ray<double> * __thiscall camera<double>::getRay(camera<double> *this,double *s,double *t)

{
  double *in_RSI;
  ray<double> *in_RDI;
  double time;
  vec3<double> off;
  vec3<double> rd;
  double *in_stack_fffffffffffffe78;
  vec3<double> *pvVar1;
  double *max;
  double *min;
  vec3<double> *in_stack_fffffffffffffe98;
  ray<double> *u;
  vec3<double> local_d0;
  point3<double> local_b8;
  double local_a0;
  double local_80;
  vec3<double> local_30 [2];
  
  pvVar1 = (vec3<double> *)(in_RSI + 0x15);
  u = in_RDI;
  random_disk_hat<double>();
  operator*(in_RSI,in_stack_fffffffffffffe98);
  max = in_RSI + 0xc;
  local_80 = vec3<double>::getX(local_30);
  operator*(pvVar1,in_stack_fffffffffffffe78);
  min = in_RSI + 0xf;
  local_a0 = vec3<double>::getY(local_30);
  operator*(pvVar1,in_stack_fffffffffffffe78);
  operator+(&u->o_,&in_RDI->o_);
  operator+(&u->o_,&in_RDI->o_);
  pvVar1 = (vec3<double> *)(in_RSI + 3);
  operator*(in_RSI,pvVar1);
  operator+(&u->o_,&in_RDI->o_);
  operator*(in_RSI,pvVar1);
  operator+(&u->o_,&in_RDI->o_);
  operator-(&u->o_,&in_RDI->o_);
  operator-(&u->o_,&in_RDI->o_);
  time = random_double(min,max);
  ray<double>::ray(in_RDI,&local_b8,&local_d0,time);
  return u;
}

Assistant:

ray<T> getRay(const T& s, const T& t) const {
    vec3<T> rd = r_ * random_disk_hat<T>();
    vec3<T> off = u * rd.getX() + v * rd.getY();

    return ray<T>(o_ + off, llc_ + s * hor_ + t * ver_ - o_ - off,
                  random_double(t0_, t1_));
    // return ray<T>(o_, llc_ + s * hor_ + t * ver_ - o_);
  }